

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O3

TimeZone * __thiscall icu_63::Calendar::orphanTimeZone(Calendar *this)

{
  TimeZone *pTVar1;
  TimeZone *pTVar2;
  
  pTVar1 = TimeZone::createDefault();
  if (pTVar1 == (TimeZone *)0x0) {
    pTVar2 = (TimeZone *)0x0;
  }
  else {
    pTVar2 = this->fZone;
    this->fZone = pTVar1;
  }
  return pTVar2;
}

Assistant:

TimeZone*
Calendar::orphanTimeZone()
{
    // we let go of the time zone; the new time zone is the system default time zone
    TimeZone *defaultZone = TimeZone::createDefault();
    if (defaultZone == NULL) {
        // No error handling available. Must keep fZone non-NULL, there are many unchecked uses.
        return NULL;
    }
    TimeZone *z = fZone;
    fZone = defaultZone;
    return z;
}